

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::Create
          (RTPUDPv6Transmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  undefined8 uVar1;
  RTPTransmissionParams *pRVar2;
  bool bVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  TransmissionProtocol TVar7;
  int iVar8;
  uint uVar9;
  list<in6_addr,_std::allocator<in6_addr>_> *__x;
  RTPAbortDescriptors *pRVar10;
  anon_union_16_3_a3f0114d_for___in6_u aVar11;
  int status_1;
  int local_bc;
  int status;
  uint size;
  sockaddr_in6 addr;
  undefined1 local_90 [8];
  RTPUDPv6TransmissionParams defaultparams;
  RTPUDPv6TransmissionParams *params;
  RTPTransmissionParams *transparams_local;
  size_t maximumpacketsize_local;
  RTPUDPv6Transmitter *this_local;
  
  RTPUDPv6TransmissionParams::RTPUDPv6TransmissionParams((RTPUDPv6TransmissionParams *)local_90);
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x72;
  }
  else if ((this->created & 1U) == 0) {
    if (transparams == (RTPTransmissionParams *)0x0) {
      pRVar2 = (RTPTransmissionParams *)local_90;
    }
    else {
      TVar7 = RTPTransmissionParams::GetTransmissionProtocol(transparams);
      pRVar2 = transparams;
      if (TVar7 != IPv6UDPProto) {
        this_local._4_4_ = -0x6b;
        goto LAB_0015a225;
      }
    }
    defaultparams.m_pAbortDesc = (RTPAbortDescriptors *)pRVar2;
    uVar5 = RTPUDPv6TransmissionParams::GetPortbase
                      ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
    if ((uint)uVar5 % 2 == 0) {
      iVar8 = socket(10,2,0);
      this->rtpsock = iVar8;
      if (this->rtpsock == -1) {
        this_local._4_4_ = -99;
      }
      else {
        iVar8 = socket(10,2,0);
        this->rtcpsock = iVar8;
        if (this->rtcpsock == -1) {
          close(this->rtpsock);
          this_local._4_4_ = -99;
        }
        else {
          local_bc = RTPUDPv6TransmissionParams::GetRTPReceiveBuffer
                               ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
          iVar8 = setsockopt(this->rtpsock,1,8,&local_bc,4);
          if (iVar8 == 0) {
            local_bc = RTPUDPv6TransmissionParams::GetRTPSendBuffer
                                 ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
            iVar8 = setsockopt(this->rtpsock,1,7,&local_bc,4);
            if (iVar8 == 0) {
              local_bc = RTPUDPv6TransmissionParams::GetRTCPReceiveBuffer
                                   ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
              iVar8 = setsockopt(this->rtcpsock,1,8,&local_bc,4);
              if (iVar8 == 0) {
                local_bc = RTPUDPv6TransmissionParams::GetRTCPSendBuffer
                                     ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
                iVar8 = setsockopt(this->rtcpsock,1,7,&local_bc,4);
                if (iVar8 == 0) {
                  aVar11 = (anon_union_16_3_a3f0114d_for___in6_u)
                           RTPUDPv6TransmissionParams::GetBindIP
                                     ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
                  (this->bindIP).__in6_u = aVar11;
                  uVar9 = RTPUDPv6TransmissionParams::GetMulticastInterfaceIndex
                                    ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
                  this->mcastifidx = uVar9;
                  addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
                  addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
                  addr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
                  addr.sin6_family = 0;
                  addr.sin6_port = 0;
                  addr.sin6_flowinfo = 0;
                  status._0_2_ = 10;
                  status._2_1_ = '\0';
                  status._3_1_ = '\0';
                  size._0_1_ = '\0';
                  size._1_1_ = '\0';
                  size._2_1_ = '\0';
                  size._3_1_ = '\0';
                  uVar5 = RTPUDPv6TransmissionParams::GetPortbase
                                    ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
                  uVar6 = htons(uVar5);
                  status = CONCAT22(uVar6,(sa_family_t)status);
                  uVar1 = *(undefined8 *)&(this->bindIP).__in6_u;
                  addr._0_4_ = SUB84(uVar1,0);
                  addr.sin6_flowinfo = (uint32_t)((ulong)uVar1 >> 0x20);
                  uVar1 = *(undefined8 *)((long)&(this->bindIP).__in6_u + 8);
                  addr.sin6_addr.__in6_u.__u6_addr32[0] = (uint32_t)uVar1;
                  addr.sin6_addr.__in6_u.__u6_addr32[1] = (uint32_t)((ulong)uVar1 >> 0x20);
                  iVar8 = bind(this->rtpsock,(sockaddr *)&status,0x1c);
                  if (iVar8 == 0) {
                    addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
                    addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
                    addr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
                    addr.sin6_family = 0;
                    addr.sin6_port = 0;
                    addr.sin6_flowinfo = 0;
                    status._0_2_ = 10;
                    status._2_1_ = '\0';
                    status._3_1_ = '\0';
                    size._0_1_ = '\0';
                    size._1_1_ = '\0';
                    size._2_1_ = '\0';
                    size._3_1_ = '\0';
                    uVar5 = RTPUDPv6TransmissionParams::GetPortbase
                                      ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
                    uVar6 = htons(uVar5 + 1);
                    status = CONCAT22(uVar6,(sa_family_t)status);
                    uVar1 = *(undefined8 *)&(this->bindIP).__in6_u;
                    addr._0_4_ = SUB84(uVar1,0);
                    addr.sin6_flowinfo = (uint32_t)((ulong)uVar1 >> 0x20);
                    uVar1 = *(undefined8 *)((long)&(this->bindIP).__in6_u + 8);
                    addr.sin6_addr.__in6_u.__u6_addr32[0] = (uint32_t)uVar1;
                    addr.sin6_addr.__in6_u.__u6_addr32[1] = (uint32_t)((ulong)uVar1 >> 0x20);
                    iVar8 = bind(this->rtcpsock,(sockaddr *)&status,0x1c);
                    if (iVar8 == 0) {
                      __x = RTPUDPv6TransmissionParams::GetLocalIPList_abi_cxx11_
                                      ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc);
                      std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::operator=
                                (&this->localIPs,__x);
                      bVar3 = std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::empty
                                        (&this->localIPs);
                      if ((bVar3) &&
                         (this_local._4_4_ = CreateLocalIPList(this), this_local._4_4_ < 0)) {
                        close(this->rtpsock);
                        close(this->rtcpsock);
                      }
                      else {
                        uVar4 = RTPUDPv6TransmissionParams::GetMulticastTTL
                                          ((RTPUDPv6TransmissionParams *)defaultparams.m_pAbortDesc)
                        ;
                        bVar3 = SetMulticastTTL(this,uVar4);
                        if (bVar3) {
                          this->supportsmulticasting = true;
                        }
                        else {
                          this->supportsmulticasting = false;
                        }
                        if (maximumpacketsize < 0x10000) {
                          pRVar10 = RTPUDPv6TransmissionParams::GetCreatedAbortDescriptors
                                              ((RTPUDPv6TransmissionParams *)
                                               defaultparams.m_pAbortDesc);
                          if (pRVar10 == (RTPAbortDescriptors *)0x0) {
                            this_local._4_4_ = RTPAbortDescriptors::Init(&this->m_abortDesc);
                            if (this_local._4_4_ < 0) {
                              close(this->rtpsock);
                              close(this->rtcpsock);
                              goto LAB_0015a225;
                            }
                            this->m_pAbortDesc = &this->m_abortDesc;
                          }
                          else {
                            pRVar10 = RTPUDPv6TransmissionParams::GetCreatedAbortDescriptors
                                                ((RTPUDPv6TransmissionParams *)
                                                 defaultparams.m_pAbortDesc);
                            this->m_pAbortDesc = pRVar10;
                            bVar3 = RTPAbortDescriptors::IsInitialized(this->m_pAbortDesc);
                            if (!bVar3) {
                              close(this->rtpsock);
                              close(this->rtcpsock);
                              this_local._4_4_ = -0xae;
                              goto LAB_0015a225;
                            }
                          }
                          this->maxpacksize = maximumpacketsize;
                          uVar5 = RTPUDPv6TransmissionParams::GetPortbase
                                            ((RTPUDPv6TransmissionParams *)
                                             defaultparams.m_pAbortDesc);
                          this->portbase = uVar5;
                          uVar4 = RTPUDPv6TransmissionParams::GetMulticastTTL
                                            ((RTPUDPv6TransmissionParams *)
                                             defaultparams.m_pAbortDesc);
                          this->multicastTTL = uVar4;
                          this->receivemode = AcceptAll;
                          this->localhostname = (uint8_t *)0x0;
                          this->localhostnamelength = 0;
                          this->waitingfordata = false;
                          this->created = true;
                          this_local._4_4_ = 0;
                        }
                        else {
                          close(this->rtpsock);
                          close(this->rtcpsock);
                          this_local._4_4_ = -0x75;
                        }
                      }
                    }
                    else {
                      close(this->rtpsock);
                      close(this->rtcpsock);
                      this_local._4_4_ = -0x61;
                    }
                  }
                  else {
                    close(this->rtpsock);
                    close(this->rtcpsock);
                    this_local._4_4_ = -0x62;
                  }
                }
                else {
                  close(this->rtpsock);
                  close(this->rtcpsock);
                  this_local._4_4_ = -0x66;
                }
              }
              else {
                close(this->rtpsock);
                close(this->rtcpsock);
                this_local._4_4_ = -0x65;
              }
            }
            else {
              close(this->rtpsock);
              close(this->rtcpsock);
              this_local._4_4_ = -0x68;
            }
          }
          else {
            close(this->rtpsock);
            close(this->rtcpsock);
            this_local._4_4_ = -0x67;
          }
        }
      }
    }
    else {
      this_local._4_4_ = -0x74;
    }
  }
  else {
    this_local._4_4_ = -0x5e;
  }
LAB_0015a225:
  RTPUDPv6TransmissionParams::~RTPUDPv6TransmissionParams((RTPUDPv6TransmissionParams *)local_90);
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::Create(size_t maximumpacketsize,const RTPTransmissionParams *transparams)
{
	const RTPUDPv6TransmissionParams *params,defaultparams;
	struct sockaddr_in6 addr;
	RTPSOCKLENTYPE size;
	int status;

	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
		params = &defaultparams;
	else
	{
		if (transparams->GetTransmissionProtocol() != RTPTransmitter::IPv6UDPProto)
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_ILLEGALPARAMETERS;
		}
		params = (const RTPUDPv6TransmissionParams *)transparams;
	}

	// Check if portbase is even
	if (params->GetPortbase()%2 != 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_PORTBASENOTEVEN;
	}

	// create sockets
	
	rtpsock = socket(PF_INET6,SOCK_DGRAM,0);
	if (rtpsock == RTPSOCKERR)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTCREATESOCKET;
	}
	rtcpsock = socket(PF_INET6,SOCK_DGRAM,0);
	if (rtcpsock == RTPSOCKERR)
	{
		RTPCLOSE(rtpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTCREATESOCKET;
	}
	
	// set socket buffer sizes
	
	size = params->GetRTPReceiveBuffer();
	if (setsockopt(rtpsock,SOL_SOCKET,SO_RCVBUF,(const char *)&size,sizeof(int)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTSETRTPRECEIVEBUF;
	}
	size = params->GetRTPSendBuffer();
	if (setsockopt(rtpsock,SOL_SOCKET,SO_SNDBUF,(const char *)&size,sizeof(int)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTSETRTPTRANSMITBUF;
	}
	size = params->GetRTCPReceiveBuffer();
	if (setsockopt(rtcpsock,SOL_SOCKET,SO_RCVBUF,(const char *)&size,sizeof(int)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTSETRTCPRECEIVEBUF;
	}
	size = params->GetRTCPSendBuffer();
	if (setsockopt(rtcpsock,SOL_SOCKET,SO_SNDBUF,(const char *)&size,sizeof(int)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTSETRTCPTRANSMITBUF;
	}
	
	// bind sockets

	bindIP = params->GetBindIP();
	mcastifidx = params->GetMulticastInterfaceIndex();
	
	memset(&addr,0,sizeof(struct sockaddr_in6));
	addr.sin6_family = AF_INET6;
	addr.sin6_port = htons(params->GetPortbase());
	addr.sin6_addr = bindIP;
	if (bind(rtpsock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in6)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTBINDRTPSOCKET;
	}
	memset(&addr,0,sizeof(struct sockaddr_in6));
	addr.sin6_family = AF_INET6;
	addr.sin6_port = htons(params->GetPortbase()+1);
	addr.sin6_addr = bindIP;
	if (bind(rtcpsock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in6)) != 0)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_CANTBINDRTCPSOCKET;
	}

	// Try to obtain local IP addresses

	localIPs = params->GetLocalIPList();
	if (localIPs.empty()) // User did not provide list of local IP addresses, calculate them
	{
		int status;
		
		if ((status = CreateLocalIPList()) < 0)
		{
			RTPCLOSE(rtpsock);
			RTPCLOSE(rtcpsock);
			MAINMUTEX_UNLOCK
			return status;
		}

#ifdef RTPDEBUG
		std::cout << "Found these local IP addresses:" << std::endl;
		
		std::list<in6_addr>::const_iterator it;

		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			RTPIPv6Address a(*it);

			std::cout << a.GetAddressString() << std::endl;
		}
#endif // RTPDEBUG
	}

#ifdef RTP_SUPPORT_IPV6MULTICAST
	if (SetMulticastTTL(params->GetMulticastTTL()))
		supportsmulticasting = true;
	else
		supportsmulticasting = false;
#else // no multicast support enabled
	supportsmulticasting = false;
#endif // RTP_SUPPORT_IPV6MULTICAST

	if (maximumpacketsize > RTPUDPV6TRANS_MAXPACKSIZE)
	{
		RTPCLOSE(rtpsock);
		RTPCLOSE(rtcpsock);
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	if (!params->GetCreatedAbortDescriptors())
	{
		if ((status = m_abortDesc.Init()) < 0)
		{
			RTPCLOSE(rtpsock);
			RTPCLOSE(rtcpsock);
			MAINMUTEX_UNLOCK
			return status;
		}
		m_pAbortDesc = &m_abortDesc;
	}
	else
	{
		m_pAbortDesc = params->GetCreatedAbortDescriptors();
		if (!m_pAbortDesc->IsInitialized())
		{
			RTPCLOSE(rtpsock);
			RTPCLOSE(rtcpsock);
			MAINMUTEX_UNLOCK
			return ERR_RTP_ABORTDESC_NOTINIT;
		}
	}

	maxpacksize = maximumpacketsize;
	portbase = params->GetPortbase();
	multicastTTL = params->GetMulticastTTL();
	receivemode = RTPTransmitter::AcceptAll;

	localhostname = 0;
	localhostnamelength = 0;

	waitingfordata = false;
	created = true;
	MAINMUTEX_UNLOCK
	return 0;
}